

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O0

void set_length(CPUS390XState_conflict *env,int reg,uint64_t length)

{
  uint64_t uVar1;
  uint64_t length_local;
  int reg_local;
  CPUS390XState_conflict *env_local;
  
  if (((env->psw).mask & 0x100000000) == 0) {
    uVar1 = deposit64(env->regs[reg],0,0x20,length);
    env->regs[reg] = uVar1;
  }
  else {
    env->regs[reg] = length;
  }
  return;
}

Assistant:

static inline void set_length(CPUS390XState *env, int reg, uint64_t length)
{
    if (env->psw.mask & PSW_MASK_64) {
        /* 64-Bit mode */
        env->regs[reg] = length;
    } else {
        /* 24-Bit and 31-Bit mode */
        env->regs[reg] = deposit64(env->regs[reg], 0, 32, length);
    }
}